

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomType.cpp
# Opt level: O2

string * __thiscall
OpenMD::AtomType::getName_abi_cxx11_(string *__return_storage_ptr__,AtomType *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name_);
  return __return_storage_ptr__;
}

Assistant:

string AtomType::getName() { return name_; }